

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoMocUic.cxx
# Opt level: O3

SourceFileHandleT __thiscall
cmQtAutoMocUic::JobEvaluateT::MocFindIncludedHeader
          (JobEvaluateT *this,string *includerDir,string *includeBase)

{
  cmWorkerPool *pcVar1;
  long *plVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  long *plVar4;
  SourceFileHandleT SVar5;
  string testPath;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  
  std::operator+(&local_50,includeBase,in_RCX);
  SVar5 = MocFindHeader(this,includerDir);
  _Var3 = SVar5.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    _Var3._M_pi = extraout_RDX;
  }
  if ((this->super_JobFenceT).super_JobT.super_JobT._vptr_JobT == (_func_int **)0x0) {
    pcVar1 = (this->super_JobFenceT).super_JobT.super_JobT.Pool_;
    if (pcVar1 != (cmWorkerPool *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pcVar1);
      _Var3._M_pi = extraout_RDX_00;
    }
    plVar4 = *(long **)(*(long *)includerDir->_M_string_length + 0x338);
    plVar2 = *(long **)(*(long *)includerDir->_M_string_length + 0x340);
    if (plVar4 != plVar2) {
      do {
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char*>((string *)&local_50,*plVar4,plVar4[1] + *plVar4);
        std::__cxx11::string::push_back((char)&local_50);
        std::__cxx11::string::_M_append((char *)&local_50,(ulong)(in_RCX->_M_dataplus)._M_p);
        SVar5 = MocFindHeader(this,includerDir);
        _Var3 = SVar5.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
        if ((this->super_JobFenceT).super_JobT.super_JobT._vptr_JobT != (_func_int **)0x0) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            _Var3._M_pi = extraout_RDX_03;
          }
          goto LAB_0019d7e6;
        }
        pcVar1 = (this->super_JobFenceT).super_JobT.super_JobT.Pool_;
        if (pcVar1 != (cmWorkerPool *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pcVar1);
          _Var3._M_pi = extraout_RDX_01;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          _Var3._M_pi = extraout_RDX_02;
        }
        plVar4 = plVar4 + 4;
      } while (plVar4 != plVar2);
    }
    (this->super_JobFenceT).super_JobT.super_JobT._vptr_JobT = (_func_int **)0x0;
    (this->super_JobFenceT).super_JobT.super_JobT.Pool_ = (cmWorkerPool *)0x0;
  }
LAB_0019d7e6:
  SVar5.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var3._M_pi;
  SVar5.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (SourceFileHandleT)
         SVar5.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

cmQtAutoMocUic::SourceFileHandleT
cmQtAutoMocUic::JobEvaluateT::MocFindIncludedHeader(
  std::string const& includerDir, std::string const& includeBase) const
{
  // Search in vicinity of the source
  {
    SourceFileHandleT res = MocFindHeader(includerDir + includeBase);
    if (res) {
      return res;
    }
  }
  // Search in include directories
  for (std::string const& path : MocConst().IncludePaths) {
    std::string testPath = path;
    testPath += '/';
    testPath += includeBase;
    SourceFileHandleT res = MocFindHeader(testPath);
    if (res) {
      return res;
    }
  }
  // Return without success
  return SourceFileHandleT();
}